

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

size_t __thiscall Messages::Person_PhoneNumber::ByteSizeLong(Person_PhoneNumber *this)

{
  size_type sVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 1) == 0) {
    sVar3 = 0;
  }
  else {
    sVar1 = ((this->number_).ptr_)->_M_string_length;
    uVar6 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if ((uVar4 & 2) != 0) {
    if (this->type_ < 0) {
      uVar5 = 0xb;
    }
    else {
      uVar4 = this->type_ | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar3 = sVar3 + uVar5;
  }
  if ((this->field_0x8 & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
    return sVar3;
  }
  sVar3 = google::protobuf::internal::ComputeUnknownFieldsSize
                    ((InternalMetadata *)&this->field_0x8,sVar3,&this->_cached_size_);
  return sVar3;
}

Assistant:

size_t Person_PhoneNumber::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:Messages.Person.PhoneNumber)
  size_t total_size = 0;

  // required string number = 1;
  if (_internal_has_number()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_number());
  }
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // optional .Messages.Person.PhoneType type = 2 [default = HOME];
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000002u) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_type());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}